

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

State * __thiscall despot::BaseTag::CreateStartState(BaseTag *this,string *type)

{
  int iVar1;
  State *this_00;
  const_reference ppTVar2;
  int n;
  string *type_local;
  BaseTag *this_local;
  
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::size(&this->states_);
  iVar1 = despot::Random::NextInt(0x15b198);
  this_00 = (State *)operator_new(0x20);
  ppTVar2 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::operator[]
                      (&this->states_,(long)iVar1);
  TagState::TagState((TagState *)this_00,*ppTVar2);
  return this_00;
}

Assistant:

State* BaseTag::CreateStartState(string type) const {
	int n = Random::RANDOM.NextInt(states_.size());
	return new TagState(*states_[n]);
}